

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_progress(nk_context *ctx,nk_size *cur,nk_size max,nk_bool is_modifyable)

{
  long lVar1;
  nk_size nVar2;
  nk_widget_layout_states nVar3;
  nk_size nVar4;
  nk_size *in_RSI;
  nk_style_progress *in_RDI;
  nk_size unaff_retaddr;
  nk_size in_stack_00000008;
  nk_size old_value;
  nk_flags *in_stack_00000018;
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_input *in;
  nk_style *style;
  nk_panel *layout;
  nk_window *win;
  nk_bool in_stack_fffffffffffffffc;
  uint uVar5;
  
  if ((((in_RDI == (nk_style_progress *)0x0) ||
       (lVar1._0_4_ = in_RDI[0x40].cursor_rounding, lVar1._4_4_ = in_RDI[0x40].padding.x, lVar1 == 0
       )) || (*(long *)(*(long *)&in_RDI[0x40].cursor_rounding + 0xa8) == 0)) ||
     (in_RSI == (nk_size *)0x0)) {
    uVar5 = 0;
  }
  else {
    nVar3 = nk_widget(*(nk_rect **)(*(long *)&in_RDI[0x40].cursor_rounding + 0xa8),
                      (nk_context *)&in_RDI[1].cursor_normal);
    if (nVar3 == NK_WIDGET_INVALID) {
      uVar5 = 0;
    }
    else {
      nVar2 = *in_RSI;
      nVar4 = nk_do_progress(in_stack_00000018,(nk_command_buffer *)old_value,bounds,
                             in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc,in_RDI,
                             (nk_input *)layout);
      *in_RSI = nVar4;
      uVar5 = (uint)(*in_RSI != nVar2);
    }
  }
  return uVar5;
}

Assistant:

NK_API nk_bool
nk_progress(struct nk_context *ctx, nk_size *cur, nk_size max, nk_bool is_modifyable)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_style *style;
struct nk_input *in;

struct nk_rect bounds;
enum nk_widget_layout_states state;
nk_size old_value;

NK_ASSERT(ctx);
NK_ASSERT(cur);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout || !cur)
return 0;

win = ctx->current;
style = &ctx->style;
layout = win->layout;
state = nk_widget(&bounds, ctx);
if (!state) return 0;

in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
old_value = *cur;
*cur = nk_do_progress(&ctx->last_widget_state, &win->buffer, bounds,
*cur, max, is_modifyable, &style->progress, in);
return (*cur != old_value);
}